

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::stack_type<cs::method_base_*,_std::allocator>::destroy
          (stack_type<cs::method_base_*,_std::allocator> *this)

{
  new_allocator<std::aligned_storage<8UL,_8UL>::type> *in_RDI;
  type *in_stack_ffffffffffffffe8;
  
  while (*(long *)(in_RDI + 8) != *(long *)in_RDI) {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -8;
  }
  __gnu_cxx::new_allocator<std::aligned_storage<8UL,_8UL>::type>::deallocate
            (in_RDI,in_stack_ffffffffffffffe8,0x506a0d);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}